

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

void __thiscall
phpconvert::ZendParser::generatePreparedTypesGlobal
          (ZendParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmp)

{
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *pvVar1;
  pointer outPrep;
  
  pvVar1 = this->typesRegistry;
  for (outPrep = (pvVar1->
                 super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      outPrep !=
      (pvVar1->
      super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
      )._M_impl.super__Vector_impl_data._M_finish; outPrep = outPrep + 1) {
    generatePreparedTypeFull(this,outPrep,tmp);
    pvVar1 = this->typesRegistry;
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypesGlobal(vector<string> &tmp) {
        vector<PreparedType>::iterator type = typesRegistry->begin();
        for (; type != typesRegistry->end(); ++type) {
            generatePreparedTypeFull(*type, tmp);
        }
    }